

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

FILE * open_file(char *name,char *mode)

{
  int iVar1;
  FILE *pFVar2;
  size_t sVar3;
  FILE *pFVar4;
  long lVar5;
  char testname [256];
  char acStack_128 [256];
  
  pFVar2 = fopen(name,mode);
  if (pFVar2 == (FILE *)0x0) {
    pFVar2 = (FILE *)0x0;
    iVar1 = incpathCount;
    for (lVar5 = 0; lVar5 < iVar1; lVar5 = lVar5 + 1) {
      if (incpath[str_offset[lVar5]] != '\0') {
        strcpy(acStack_128,incpath + str_offset[lVar5]);
        sVar3 = strlen(acStack_128);
        (acStack_128 + sVar3)[0] = '/';
        (acStack_128 + sVar3)[1] = '\0';
        strcat(acStack_128,name);
        pFVar4 = fopen(acStack_128,mode);
        iVar1 = incpathCount;
        if (pFVar4 != (FILE *)0x0) {
          return (FILE *)pFVar4;
        }
      }
    }
  }
  return (FILE *)pFVar2;
}

Assistant:

FILE *
open_file(char *name, char *mode)
{
	FILE 	*fileptr;
	char	testname[256];
	int	i;

	fileptr = fopen(name, mode);
	if (fileptr != NULL) return(fileptr);

	for (i = 0; i < incpathCount; ++i) {
		if (strlen(incpath+str_offset[i])) {
			strcpy(testname, incpath+str_offset[i]);
			strcat(testname, PATH_SEPARATOR_STRING);
			strcat(testname, name);
		
			fileptr = fopen(testname, mode);
			if (fileptr != NULL) break;
		}
	}

	return (fileptr);
}